

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_check_cert_usage
              (mbedtls_x509_crt *cert,mbedtls_ssl_ciphersuite_t *ciphersuite,int cert_endpoint,
              uint32_t *flags)

{
  int iVar1;
  size_t ext_len;
  char *ext_oid;
  int usage;
  int ret;
  uint32_t *flags_local;
  int cert_endpoint_local;
  mbedtls_ssl_ciphersuite_t *ciphersuite_local;
  mbedtls_x509_crt *cert_local;
  
  ext_oid._4_4_ = 0;
  ext_oid._0_4_ = 0;
  if (cert_endpoint == 1) {
    switch(ciphersuite->key_exchange) {
    case '\0':
    case '\x05':
    case '\x06':
    case '\b':
    case '\v':
      ext_oid._0_4_ = 0;
      break;
    case '\x01':
    case '\a':
      ext_oid._0_4_ = 0x20;
      break;
    case '\x02':
    case '\x03':
    case '\x04':
      ext_oid._0_4_ = 0x80;
      break;
    case '\t':
    case '\n':
      ext_oid._0_4_ = 8;
    }
  }
  else {
    ext_oid._0_4_ = 0x80;
  }
  iVar1 = mbedtls_x509_crt_check_key_usage(cert,(uint)ext_oid);
  if (iVar1 != 0) {
    *flags = *flags | 0x800;
    ext_oid._4_4_ = -1;
  }
  if (cert_endpoint == 1) {
    ext_len = (size_t)anon_var_dwarf_244f22;
  }
  else {
    ext_len = (size_t)anon_var_dwarf_244f2d;
  }
  iVar1 = mbedtls_x509_crt_check_extended_key_usage(cert,(char *)ext_len,8);
  if (iVar1 != 0) {
    *flags = *flags | 0x1000;
    ext_oid._4_4_ = -1;
  }
  return ext_oid._4_4_;
}

Assistant:

int mbedtls_ssl_check_cert_usage(const mbedtls_x509_crt *cert,
                                 const mbedtls_ssl_ciphersuite_t *ciphersuite,
                                 int cert_endpoint,
                                 uint32_t *flags)
{
    int ret = 0;
    int usage = 0;
    const char *ext_oid;
    size_t ext_len;

    if (cert_endpoint == MBEDTLS_SSL_IS_SERVER) {
        /* Server part of the key exchange */
        switch (ciphersuite->key_exchange) {
            case MBEDTLS_KEY_EXCHANGE_RSA:
            case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
                usage = MBEDTLS_X509_KU_KEY_ENCIPHERMENT;
                break;

            case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
            case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
            case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
                usage = MBEDTLS_X509_KU_DIGITAL_SIGNATURE;
                break;

            case MBEDTLS_KEY_EXCHANGE_ECDH_RSA:
            case MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA:
                usage = MBEDTLS_X509_KU_KEY_AGREEMENT;
                break;

            /* Don't use default: we want warnings when adding new values */
            case MBEDTLS_KEY_EXCHANGE_NONE:
            case MBEDTLS_KEY_EXCHANGE_PSK:
            case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
            case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
            case MBEDTLS_KEY_EXCHANGE_ECJPAKE:
                usage = 0;
        }
    } else {
        /* Client auth: we only implement rsa_sign and mbedtls_ecdsa_sign for now */
        usage = MBEDTLS_X509_KU_DIGITAL_SIGNATURE;
    }

    if (mbedtls_x509_crt_check_key_usage(cert, usage) != 0) {
        *flags |= MBEDTLS_X509_BADCERT_KEY_USAGE;
        ret = -1;
    }

    if (cert_endpoint == MBEDTLS_SSL_IS_SERVER) {
        ext_oid = MBEDTLS_OID_SERVER_AUTH;
        ext_len = MBEDTLS_OID_SIZE(MBEDTLS_OID_SERVER_AUTH);
    } else {
        ext_oid = MBEDTLS_OID_CLIENT_AUTH;
        ext_len = MBEDTLS_OID_SIZE(MBEDTLS_OID_CLIENT_AUTH);
    }

    if (mbedtls_x509_crt_check_extended_key_usage(cert, ext_oid, ext_len) != 0) {
        *flags |= MBEDTLS_X509_BADCERT_EXT_KEY_USAGE;
        ret = -1;
    }

    return ret;
}